

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O2

void __thiscall
prometheus::detail::MetricsHandler::RegisterCollectable
          (MetricsHandler *this,weak_ptr<prometheus::Collectable> *collectable)

{
  std::mutex::lock(&this->collectables_mutex_);
  CleanupStalePointers(&this->collectables_);
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::push_back(&this->collectables_,collectable);
  pthread_mutex_unlock((pthread_mutex_t *)&this->collectables_mutex_);
  return;
}

Assistant:

void MetricsHandler::RegisterCollectable(
    const std::weak_ptr<Collectable>& collectable) {
  std::lock_guard<std::mutex> lock{collectables_mutex_};
  CleanupStalePointers(collectables_);
  collectables_.push_back(collectable);
}